

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

int store_frame_record(int64_t ts_start,int64_t ts_end,size_t encoded_size,int pic_size,
                      int frame_header_count,int tiles,int show_frame,int show_existing_frame,
                      FrameWindowBuffer *buffer)

{
  FrameRecord *pFVar1;
  int iVar2;
  FrameRecord *record;
  int new_idx;
  int tiles_local;
  int frame_header_count_local;
  int pic_size_local;
  size_t encoded_size_local;
  int64_t ts_end_local;
  int64_t ts_start_local;
  
  if (buffer->num < 0x100) {
    buffer->num = buffer->num + 1;
  }
  else {
    buffer->start = (buffer->start + 1) % 0x100;
  }
  iVar2 = (buffer->start + buffer->num + -1) % 0x100;
  pFVar1 = buffer->buf + iVar2;
  pFVar1->ts_start = ts_start;
  pFVar1->ts_end = ts_end;
  pFVar1->encoded_size_in_bytes = encoded_size;
  pFVar1->pic_size = pic_size;
  pFVar1->frame_header_count = frame_header_count;
  pFVar1->tiles = tiles;
  pFVar1->show_frame = show_frame;
  pFVar1->show_existing_frame = show_existing_frame;
  return iVar2;
}

Assistant:

static int store_frame_record(int64_t ts_start, int64_t ts_end,
                              size_t encoded_size, int pic_size,
                              int frame_header_count, int tiles, int show_frame,
                              int show_existing_frame,
                              FrameWindowBuffer *const buffer) {
  if (buffer->num < FRAME_WINDOW_SIZE) {
    ++buffer->num;
  } else {
    buffer->start = (buffer->start + 1) % FRAME_WINDOW_SIZE;
  }
  const int new_idx = (buffer->start + buffer->num - 1) % FRAME_WINDOW_SIZE;
  FrameRecord *const record = &buffer->buf[new_idx];
  record->ts_start = ts_start;
  record->ts_end = ts_end;
  record->encoded_size_in_bytes = encoded_size;
  record->pic_size = pic_size;
  record->frame_header_count = frame_header_count;
  record->tiles = tiles;
  record->show_frame = show_frame;
  record->show_existing_frame = show_existing_frame;

  return new_idx;
}